

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O3

rb_node * lyds_get_rb_tree(lyd_node *leader,lyd_meta **meta)

{
  lyd_meta *plVar1;
  int iVar2;
  
  if (meta != (lyd_meta **)0x0) {
    *meta = (lyd_meta *)0x0;
  }
  plVar1 = leader->meta;
  while( true ) {
    if (plVar1 == (lyd_meta *)0x0) {
      return (rb_node *)0x0;
    }
    iVar2 = strcmp(plVar1->name,"lyds_tree");
    if (iVar2 == 0) break;
    plVar1 = plVar1->next;
  }
  if (meta != (lyd_meta **)0x0) {
    *meta = plVar1;
  }
  return (rb_node *)(plVar1->value).field_2.dec64;
}

Assistant:

static struct rb_node *
lyds_get_rb_tree(const struct lyd_node *leader, struct lyd_meta **meta)
{
    struct rb_node *rbt;
    struct lyd_meta *iter;

    if (meta) {
        *meta = NULL;
    }
    LY_LIST_FOR(leader->meta, iter) {
        if (!strcmp(iter->name, "lyds_tree")) {
            if (meta) {
                *meta = iter;
            }
            RBT_GET(iter, rbt);
            return rbt;
        }
    }

    return NULL;
}